

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O2

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoTriangle> *this,TPZVec<long> *nodeindexes)

{
  long lVar1;
  
  TPZGeoTriangle::TPZGeoTriangle(&this->super_TPZGeoTriangle,&PTR_PTR_016c4028,nodeindexes);
  (this->super_TPZGeoTriangle).super_TPZNodeRep<3,_pztopology::TPZTriangle>.super_TPZTriangle.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_016c3fd0;
  lVar1 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1) =
         &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar1) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar1) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x78);
  lVar1 = 0;
  do {
    TPZTransform<double>::TPZTransform
              ((TPZTransform<double> *)((long)(this->fNeighbours + 5) + lVar1));
    lVar1 = lVar1 + 0x1a0;
  } while (lVar1 != 0x820);
  return;
}

Assistant:

TPZGeoBlend(TPZVec<int64_t> &nodeindexes) : TPZRegisterClassId(&TPZGeoBlend::ClassId),
                                                    TGeo(nodeindexes) {
        }